

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileDefinitionsCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_f5dd8b::TargetCompileDefinitionsImpl::HandleDirectContent
          (TargetCompileDefinitionsImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  optional<cmListFileBacktrace> local_78;
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"COMPILE_DEFINITIONS","",CONCAT71(in_register_00000009,param_3));
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])(&local_40,this,content);
  cmMakefile::GetBacktrace((this->super_cmTargetPropCommandBase).Makefile);
  local_78.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
  super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
  super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)_Stack_80._M_pi;
  local_78.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
  super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
  super__Optional_payload_base<cmListFileBacktrace>._M_engaged = true;
  cmTarget::AppendProperty(tgt,&local_60,&local_40,&local_78,false);
  if ((local_78.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
       super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
       super__Optional_payload_base<cmListFileBacktrace>._M_engaged == true) &&
     (local_78.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
      super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
      super__Optional_payload_base<cmListFileBacktrace>._M_engaged = false,
     local_78.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
     super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
     super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
     super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
               super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
               super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
               super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    tgt->AppendProperty("COMPILE_DEFINITIONS", this->Join(content),
                        this->Makefile->GetBacktrace());
    return true; // Successfully handled.
  }